

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_cas2w_m68k(CPUM68KState_conflict *env,uint32_t regs,uint32_t a1,uint32_t a2)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uintptr_t unaff_retaddr;
  uintptr_t ra;
  int16_t l2;
  int16_t l1;
  int16_t u2;
  int16_t u1;
  int16_t c2;
  int16_t c1;
  uint32_t Du2;
  uint32_t Du1;
  uint32_t Dc2;
  uint32_t Dc1;
  uint32_t a2_local;
  uint32_t a1_local;
  uint32_t regs_local;
  CPUM68KState_conflict *env_local;
  
  uVar5 = extract32(regs,9,3);
  uVar6 = extract32(regs,6,3);
  uVar7 = extract32(regs,3,3);
  uVar8 = extract32(regs,0,3);
  sVar1 = (short)env->dregs[uVar5];
  sVar2 = (short)env->dregs[uVar6];
  uVar7 = env->dregs[uVar7];
  uVar8 = env->dregs[uVar8];
  uVar9 = cpu_lduw_data_ra_m68k(env,a1,unaff_retaddr);
  sVar3 = (short)uVar9;
  uVar9 = cpu_lduw_data_ra_m68k(env,a2,unaff_retaddr);
  sVar4 = (short)uVar9;
  if ((sVar3 == sVar1) && (sVar4 == sVar2)) {
    cpu_stw_data_ra_m68k(env,a1,(int)(short)uVar7,unaff_retaddr);
    cpu_stw_data_ra_m68k(env,a2,(int)(short)uVar8,unaff_retaddr);
  }
  if (sVar1 == sVar3) {
    env->cc_n = (int)sVar4;
    env->cc_v = (int)sVar2;
  }
  else {
    env->cc_n = (int)sVar3;
    env->cc_v = (int)sVar1;
  }
  env->cc_op = 9;
  uVar7 = deposit32(env->dregs[uVar5],0,0x10,(int)sVar3);
  env->dregs[uVar5] = uVar7;
  uVar7 = deposit32(env->dregs[uVar6],0,0x10,(int)sVar4);
  env->dregs[uVar6] = uVar7;
  return;
}

Assistant:

void HELPER(cas2w)(CPUM68KState *env, uint32_t regs, uint32_t a1, uint32_t a2)
{
    uint32_t Dc1 = extract32(regs, 9, 3);
    uint32_t Dc2 = extract32(regs, 6, 3);
    uint32_t Du1 = extract32(regs, 3, 3);
    uint32_t Du2 = extract32(regs, 0, 3);
    int16_t c1 = env->dregs[Dc1];
    int16_t c2 = env->dregs[Dc2];
    int16_t u1 = env->dregs[Du1];
    int16_t u2 = env->dregs[Du2];
    int16_t l1, l2;
    uintptr_t ra = GETPC();

    l1 = cpu_lduw_data_ra(env, a1, ra);
    l2 = cpu_lduw_data_ra(env, a2, ra);
    if (l1 == c1 && l2 == c2) {
        cpu_stw_data_ra(env, a1, u1, ra);
        cpu_stw_data_ra(env, a2, u2, ra);
    }

    if (c1 != l1) {
        env->cc_n = l1;
        env->cc_v = c1;
    } else {
        env->cc_n = l2;
        env->cc_v = c2;
    }
    env->cc_op = CC_OP_CMPW;
    env->dregs[Dc1] = deposit32(env->dregs[Dc1], 0, 16, l1);
    env->dregs[Dc2] = deposit32(env->dregs[Dc2], 0, 16, l2);
}